

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O2

void __thiscall wasm::Flatten::Flatten(Flatten *this)

{
  WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
  ::WalkerPass(&this->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
              );
  (this->
  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Flatten,_wasm::UnifiedExpressionVisitor<wasm::Flatten,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__Flatten_00e1e520;
  (this->preludes)._M_h._M_buckets = &(this->preludes)._M_h._M_single_bucket;
  (this->preludes)._M_h._M_bucket_count = 1;
  (this->preludes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->preludes)._M_h._M_element_count = 0;
  (this->preludes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->preludes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->preludes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->breakTemps)._M_h._M_buckets = &(this->breakTemps)._M_h._M_single_bucket;
  (this->breakTemps)._M_h._M_bucket_count = 1;
  (this->breakTemps)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->breakTemps)._M_h._M_element_count = 0;
  (this->breakTemps)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->breakTemps)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->breakTemps)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }